

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

double __thiscall fasttext::Args::getAutotuneMetricValue(Args *this)

{
  int iVar1;
  long *__nptr;
  metric_name mVar2;
  int *piVar3;
  undefined8 uVar4;
  float fVar5;
  string valueStr;
  long *local_48;
  long *local_40 [2];
  long local_30 [2];
  
  mVar2 = getAutotuneMetric(this);
  if (3 < mVar2 - precisionAtRecall) {
    return 0.0;
  }
  std::__cxx11::string::find((char)&this->autotuneMetric,0x3a);
  std::__cxx11::string::substr((ulong)local_40,(ulong)&this->autotuneMetric);
  __nptr = local_40[0];
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  fVar5 = strtof((char *)__nptr,(char **)&local_48);
  if (local_48 == __nptr) {
    uVar4 = std::__throw_invalid_argument("stof");
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    getAutotuneMetricValue();
    _Unwind_Resume(uVar4);
  }
  if (*piVar3 != 0) {
    if (*piVar3 != 0x22) goto LAB_00122b99;
    fVar5 = (float)std::__throw_out_of_range("stof");
  }
  *piVar3 = iVar1;
LAB_00122b99:
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return (double)fVar5 / 100.0;
}

Assistant:

double Args::getAutotuneMetricValue() const {
  metric_name metric = getAutotuneMetric();
  double value = 0.0;
  if (metric == metric_name::precisionAtRecallLabel ||
      metric == metric_name::precisionAtRecall ||
      metric == metric_name::recallAtPrecisionLabel ||
      metric == metric_name::recallAtPrecision) {
    size_t firstSemicolon = 18; // semicolon position in "precisionAtRecall:"
    size_t secondSemicolon = autotuneMetric.find(':', firstSemicolon);
    const std::string valueStr =
        autotuneMetric.substr(firstSemicolon, secondSemicolon - firstSemicolon);
    value = std::stof(valueStr) / 100.0;
  }
  return value;
}